

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool extract_if_dead(connectdata *conn,Curl_easy *data)

{
  uint uVar1;
  _Bool local_29;
  uint state;
  _Bool dead;
  size_t pipeLen;
  Curl_easy *data_local;
  connectdata *conn_local;
  
  if (((conn->send_pipe).size + (conn->recv_pipe).size == 0) &&
     ((conn->send_pipe).size + (conn->recv_pipe).size == 0)) {
    conn->data = data;
    if (conn->handler->connection_check == (_func_uint_connectdata_ptr_uint *)0x0) {
      local_29 = SocketIsDead(conn->sock[0]);
    }
    else {
      uVar1 = (*conn->handler->connection_check)(conn,1);
      local_29 = (uVar1 & 1) != 0;
    }
    if (local_29 != false) {
      Curl_infof(data,"Connection %ld seems to be dead!\n",conn->connection_id);
      Curl_conncache_remove_conn(conn,false);
      conn->data = (Curl_easy *)0x0;
      return true;
    }
  }
  return false;
}

Assistant:

static bool extract_if_dead(struct connectdata *conn,
                            struct Curl_easy *data)
{
  size_t pipeLen = conn->send_pipe.size + conn->recv_pipe.size;
  if(!pipeLen && !CONN_INUSE(conn)) {
    /* The check for a dead socket makes sense only if there are no
       handles in pipeline and the connection isn't already marked in
       use */
    bool dead;

    conn->data = data;
    if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;

      state = conn->handler->connection_check(conn, CONNCHECK_ISDEAD);
      dead = (state & CONNRESULT_DEAD);
    }
    else {
      /* Use the general method for determining the death of a connection */
      dead = SocketIsDead(conn->sock[FIRSTSOCKET]);
    }

    if(dead) {
      infof(data, "Connection %ld seems to be dead!\n", conn->connection_id);
      Curl_conncache_remove_conn(conn, FALSE);
      conn->data = NULL; /* detach */
      return TRUE;
    }
  }
  return FALSE;
}